

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O1

Board * pyramid_boardCreate(Card **cards,unsigned_long cardsCount)

{
  Board *board;
  Spot *pSVar1;
  undefined1 *puVar2;
  uchar spotIndex;
  long lVar3;
  
  board = board_create();
  spotIndex = '\0';
  pSVar1 = spot_create(STOCK,'\0');
  board_spotAdd(board,pSVar1);
  pSVar1 = spot_create(FOUNDATION,'\0');
  board_spotAdd(board,pSVar1);
  pSVar1 = spot_create(WASTE,'\0');
  board_spotAdd(board,pSVar1);
  do {
    pSVar1 = spot_create(TABLEAU,spotIndex);
    board_spotAdd(board,pSVar1);
    spotIndex = spotIndex + '\x01';
  } while (spotIndex != '\x1c');
  lVar3 = 0;
  do {
    board_cardAdd(board,TABLEAU,(uchar)lVar3,cards[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1c);
  lVar3 = 0;
  do {
    board_cardAdd(board,STOCK,'\0',cards[lVar3 + 0x1c]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x18);
  if (((gConfig.game)->id | BAKERSGAMEKINGSONLY) == PYRAMIDRELAXEDEASY) {
    puVar2 = (undefined1 *)malloc(1);
    board->gameState = puVar2;
    *puVar2 = 0;
  }
  return board;
}

Assistant:

Board * pyramid_boardCreate(Card ** cards, unsigned long cardsCount)
{
	Board * board = board_create();
	unsigned char i;

	board_spotAdd(board, spot_create(STOCK, 0));
	board_spotAdd(board, spot_create(FOUNDATION, 0));
	board_spotAdd(board, spot_create(WASTE, 0));

	for(i=0;i<28;i++)
	{
		board_spotAdd(board, spot_create(TABLEAU, i));
	}

	for(i=0;i<28;i++)
	{
		board_cardAdd(board, TABLEAU, i, cards[i]);
	}
	for(;i<52;i++)
	{
		board_cardAdd(board, STOCK, 0, cards[i]);
	}

	if(gConfig.game->id==PYRAMIDEASY || gConfig.game->id==PYRAMIDRELAXEDEASY)
	{
		board->gameState = (unsigned char *)malloc(sizeof(unsigned char));
		*(unsigned char *)board->gameState = 0;
	}

	return board;
}